

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void transform_image_validate(transform_display *dp,png_const_structp pp,png_infop pi)

{
  png_byte colour_type;
  byte bit_depth;
  byte colour_type_00;
  png_byte bit_depth_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  png_store *ppVar8;
  png_byte sample_depth_00;
  undefined4 r_00;
  undefined4 g_00;
  uint b_00;
  uint a_00;
  png_bytep row;
  uint a;
  uint b;
  uint g;
  uint r;
  image_pixel out_pixel;
  image_pixel in_pixel;
  png_byte std [1024];
  png_uint_32 x;
  png_const_bytep pRow;
  int local_460;
  uint uStack_45c;
  png_byte in_sample_depth;
  int npalette;
  png_uint_32 y;
  store_palette out_palette;
  double local_50;
  double digitization_error;
  int have_tRNS;
  png_byte alpha_sBIT;
  png_byte blue_sBIT;
  png_byte green_sBIT;
  png_byte red_sBIT;
  png_byte sample_depth;
  png_byte out_bd;
  png_byte out_ct;
  png_uint_32 h;
  png_uint_32 w;
  png_byte in_bd;
  png_byte in_ct;
  png_store *ps;
  png_infop pi_local;
  png_const_structp pp_local;
  transform_display *dp_local;
  
  ppVar8 = (dp->this).ps;
  colour_type = (dp->this).colour_type;
  bit_depth = (dp->this).bit_depth;
  uVar5 = (dp->this).w;
  uVar6 = (dp->this).h;
  colour_type_00 = dp->output_colour_type;
  bit_depth_00 = dp->output_bit_depth;
  sample_depth_00 = bit_depth_00;
  if (colour_type_00 == 3) {
    sample_depth_00 = '\b';
  }
  bVar1 = (dp->this).red_sBIT;
  bVar2 = (dp->this).green_sBIT;
  bVar3 = (dp->this).blue_sBIT;
  bVar4 = (dp->this).alpha_sBIT;
  iVar7 = (dp->this).is_transparent;
  store_image_check((dp->this).ps,pp,0);
  if (colour_type_00 == 3) {
    local_460 = -1;
    read_palette((store_palette_entry *)&npalette,&local_460,pp,pi);
    if (local_460 != (dp->this).npalette) {
      png_error(pp,"unexpected change in palette size");
    }
    local_50 = 0.5;
  }
  else {
    memset(&npalette,0x5e,0x400);
    if ((colour_type == '\x03') || (pRow._7_1_ = bit_depth, bit_depth < 0x10)) {
      pRow._7_1_ = 8;
    }
    if (((sample_depth_00 == '\x10') && (pRow._7_1_ < 9)) &&
       ((*(uint *)&dp->pm->field_0x63c >> 0x10 & 1) != 0)) {
      local_50 = 128.5;
    }
    else {
      local_50 = 0.5;
    }
  }
  for (uStack_45c = 0; uStack_45c < uVar6; uStack_45c = uStack_45c + 1) {
    row = store_image_row(ppVar8,pp,0,uStack_45c);
    transform_row(pp,&in_pixel.red_sBIT,colour_type,bit_depth,uStack_45c);
    std[0x3fc] = '\0';
    std[0x3fd] = '\0';
    std[0x3fe] = '\0';
    std[0x3ff] = '\0';
    for (; (uint)std._1020_4_ < uVar5; std._1020_4_ = std._1020_4_ + 1) {
      image_pixel_init(&out_pixel.red_sBIT,&in_pixel.red_sBIT,colour_type,bit_depth,std._1020_4_,
                       (dp->this).palette,(image_pixel *)0x0);
      a_00 = in_pixel.green;
      b_00 = in_pixel.red;
      g_00 = out_pixel._92_4_;
      r_00 = out_pixel._88_4_;
      in_pixel.alpha._3_1_ = in_pixel.alpha._3_1_ & 0xfe | iVar7 != 0;
      in_pixel.alphae._0_1_ = bVar1;
      in_pixel.alphae._1_1_ = bVar2;
      in_pixel.alphae._2_1_ = bVar3;
      in_pixel.alphae._3_1_ = bVar4;
      (*dp->transform_list->mod)(dp->transform_list,(image_pixel *)&out_pixel.red_sBIT,pp,dp);
      image_pixel_init(&g,row,colour_type_00,bit_depth_00,std._1020_4_,
                       (store_palette_entry *)&npalette,(image_pixel *)&out_pixel.red_sBIT);
      if (((colour_type == '\x03') && (colour_type_00 == 3)) && (in_pixel.blue != out_pixel.blue)) {
        png_error(pp,"unexpected transformed palette index");
      }
      if (out_pixel._88_4_ != g) {
        transform_range_check
                  (pp,r_00,g_00,b_00,a_00,out_pixel._88_4_,(double)in_pixel._16_8_,g,sample_depth_00
                   ,in_pixel.alphaf,
                   dp->pm->limit + 1.0 / (double)((1 << (in_pixel.alphae._0_1_ & 0x1f)) * 2 - 2),
                   "red/gray",local_50);
      }
      if (((colour_type_00 & 2) != 0) && (out_pixel._92_4_ != r)) {
        transform_range_check
                  (pp,r_00,g_00,b_00,a_00,out_pixel._92_4_,in_pixel.redf,r,sample_depth_00,
                   in_pixel.rede,
                   dp->pm->limit + 1.0 / (double)((1 << (in_pixel.alphae._1_1_ & 0x1f)) * 2 - 2),
                   "green",local_50);
      }
      if (((colour_type_00 & 2) != 0) && (in_pixel.red != out_pixel.red)) {
        transform_range_check
                  (pp,r_00,g_00,b_00,a_00,in_pixel.red,in_pixel.greenf,out_pixel.red,sample_depth_00
                   ,in_pixel.greene,
                   dp->pm->limit + 1.0 / (double)((1 << (in_pixel.alphae._2_1_ & 0x1f)) * 2 - 2),
                   "blue",local_50);
      }
      if (((colour_type_00 & 4) != 0) && (in_pixel.green != out_pixel.green)) {
        transform_range_check
                  (pp,r_00,g_00,b_00,a_00,in_pixel.green,in_pixel.bluef,out_pixel.green,
                   sample_depth_00,in_pixel.bluee,
                   dp->pm->limit + 1.0 / (double)((1 << (in_pixel.alphae._3_1_ & 0x1f)) * 2 - 2),
                   "alpha",local_50);
      }
    }
  }
  ppVar8 = (dp->this).ps;
  ppVar8->field_0x18 = ppVar8->field_0x18 & 0x7f | 0x80;
  return;
}

Assistant:

static void
transform_image_validate(transform_display *dp, png_const_structp pp,
   png_infop pi)
{
   /* Constants for the loop below: */
   const png_store* const ps = dp->this.ps;
   png_byte in_ct = dp->this.colour_type;
   png_byte in_bd = dp->this.bit_depth;
   png_uint_32 w = dp->this.w;
   png_uint_32 h = dp->this.h;
   png_byte out_ct = dp->output_colour_type;
   png_byte out_bd = dp->output_bit_depth;
   png_byte sample_depth =
      (png_byte)(out_ct == PNG_COLOR_TYPE_PALETTE ? 8 : out_bd);
   png_byte red_sBIT = dp->this.red_sBIT;
   png_byte green_sBIT = dp->this.green_sBIT;
   png_byte blue_sBIT = dp->this.blue_sBIT;
   png_byte alpha_sBIT = dp->this.alpha_sBIT;
   int have_tRNS = dp->this.is_transparent;
   double digitization_error;

   store_palette out_palette;
   png_uint_32 y;

   UNUSED(pi)

   /* Check for row overwrite errors */
   store_image_check(dp->this.ps, pp, 0);

   /* Read the palette corresponding to the output if the output colour type
    * indicates a palette, otherwise set out_palette to garbage.
    */
   if (out_ct == PNG_COLOR_TYPE_PALETTE)
   {
      /* Validate that the palette count itself has not changed - this is not
       * expected.
       */
      int npalette = (-1);

      (void)read_palette(out_palette, &npalette, pp, pi);
      if (npalette != dp->this.npalette)
         png_error(pp, "unexpected change in palette size");

      digitization_error = .5;
   }
   else
   {
      png_byte in_sample_depth;

      memset(out_palette, 0x5e, sizeof out_palette);

      /* use-input-precision means assume that if the input has 8 bit (or less)
       * samples and the output has 16 bit samples the calculations will be done
       * with 8 bit precision, not 16.
       */
      if (in_ct == PNG_COLOR_TYPE_PALETTE || in_bd < 16)
         in_sample_depth = 8;
      else
         in_sample_depth = in_bd;

      if (sample_depth != 16 || in_sample_depth > 8 ||
         !dp->pm->calculations_use_input_precision)
         digitization_error = .5;

      /* Else calculations are at 8 bit precision, and the output actually
       * consists of scaled 8-bit values, so scale .5 in 8 bits to the 16 bits:
       */
      else
         digitization_error = .5 * 257;
   }

   for (y=0; y<h; ++y)
   {
      png_const_bytep const pRow = store_image_row(ps, pp, 0, y);
      png_uint_32 x;

      /* The original, standard, row pre-transforms. */
      png_byte std[STANDARD_ROWMAX];

      transform_row(pp, std, in_ct, in_bd, y);

      /* Go through each original pixel transforming it and comparing with what
       * libpng did to the same pixel.
       */
      for (x=0; x<w; ++x)
      {
         image_pixel in_pixel, out_pixel;
         unsigned int r, g, b, a;

         /* Find out what we think the pixel should be: */
         image_pixel_init(&in_pixel, std, in_ct, in_bd, x, dp->this.palette,
                 NULL);

         in_pixel.red_sBIT = red_sBIT;
         in_pixel.green_sBIT = green_sBIT;
         in_pixel.blue_sBIT = blue_sBIT;
         in_pixel.alpha_sBIT = alpha_sBIT;
         in_pixel.have_tRNS = have_tRNS != 0;

         /* For error detection, below. */
         r = in_pixel.red;
         g = in_pixel.green;
         b = in_pixel.blue;
         a = in_pixel.alpha;

         /* This applies the transforms to the input data, including output
          * format operations which must be used when reading the output
          * pixel that libpng produces.
          */
         dp->transform_list->mod(dp->transform_list, &in_pixel, pp, dp);

         /* Read the output pixel and compare it to what we got, we don't
          * use the error field here, so no need to update sBIT.  in_pixel
          * says whether we expect libpng to change the output format.
          */
         image_pixel_init(&out_pixel, pRow, out_ct, out_bd, x, out_palette,
                 &in_pixel);

         /* We don't expect changes to the index here even if the bit depth is
          * changed.
          */
         if (in_ct == PNG_COLOR_TYPE_PALETTE &&
            out_ct == PNG_COLOR_TYPE_PALETTE)
         {
            if (in_pixel.palette_index != out_pixel.palette_index)
               png_error(pp, "unexpected transformed palette index");
         }

         /* Check the colours for palette images too - in fact the palette could
          * be separately verified itself in most cases.
          */
         if (in_pixel.red != out_pixel.red)
            transform_range_check(pp, r, g, b, a, in_pixel.red, in_pixel.redf,
               out_pixel.red, sample_depth, in_pixel.rede,
               dp->pm->limit + 1./(2*((1U<<in_pixel.red_sBIT)-1)), "red/gray",
               digitization_error);

         if ((out_ct & PNG_COLOR_MASK_COLOR) != 0 &&
            in_pixel.green != out_pixel.green)
            transform_range_check(pp, r, g, b, a, in_pixel.green,
               in_pixel.greenf, out_pixel.green, sample_depth, in_pixel.greene,
               dp->pm->limit + 1./(2*((1U<<in_pixel.green_sBIT)-1)), "green",
               digitization_error);

         if ((out_ct & PNG_COLOR_MASK_COLOR) != 0 &&
            in_pixel.blue != out_pixel.blue)
            transform_range_check(pp, r, g, b, a, in_pixel.blue, in_pixel.bluef,
               out_pixel.blue, sample_depth, in_pixel.bluee,
               dp->pm->limit + 1./(2*((1U<<in_pixel.blue_sBIT)-1)), "blue",
               digitization_error);

         if ((out_ct & PNG_COLOR_MASK_ALPHA) != 0 &&
            in_pixel.alpha != out_pixel.alpha)
            transform_range_check(pp, r, g, b, a, in_pixel.alpha,
               in_pixel.alphaf, out_pixel.alpha, sample_depth, in_pixel.alphae,
               dp->pm->limit + 1./(2*((1U<<in_pixel.alpha_sBIT)-1)), "alpha",
               digitization_error);
      } /* pixel (x) loop */
   } /* row (y) loop */

   /* Record that something was actually checked to avoid a false positive. */
   dp->this.ps->validated = 1;
}